

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_jordan.cpp
# Opt level: O2

void opengv::math::gauss_jordan
               (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                *matrix,int exitCondition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer ppvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  long lVar12;
  int tempRow;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int col;
  long lVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int col_1;
  vector<int,_std::allocator<int>_> nonzeroIdx;
  long local_50;
  long local_48;
  
  ppvVar3 = (matrix->
            super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = *ppvVar3;
  uVar22 = (ulong)((long)(matrix->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3) >> 3;
  uVar14 = (uint)uVar22;
  uVar16 = (ulong)(~((int)uVar14 >> 0x1f) & uVar14);
  iVar20 = (int)((ulong)((long)*(pointer *)
                                ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data) >> 3);
  lVar18 = (long)iVar20;
  local_48 = 1;
  local_50 = -1;
  for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
    ppvVar3 = (matrix->
              super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0xffffffffffffffff;
    auVar24 = ZEXT816(0xbff0000000000000);
    for (uVar15 = uVar21; (uVar22 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           *(ulong *)(*(long *)&(ppvVar3[uVar15]->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data + uVar21 * 8);
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar23 = vandpd_avx512vl(auVar29,auVar5);
      dVar25 = auVar24._0_8_;
      auVar24 = vmaxsd_avx(auVar23,auVar24);
      if (dVar25 < auVar23._0_8_) {
        uVar11 = uVar15;
      }
      uVar11 = uVar11 & 0xffffffff;
    }
    pvVar4 = ppvVar3[(int)uVar11];
    ppvVar3[(int)uVar11] = ppvVar3[uVar21];
    ppvVar3[uVar21] = pvVar4;
    lVar17 = *(long *)&((matrix->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar21]->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data;
    dVar25 = *(double *)(lVar17 + uVar21 * 8);
    *(undefined8 *)(lVar17 + uVar21 * 8) = 0x3ff0000000000000;
    for (lVar12 = local_48; lVar12 < lVar18; lVar12 = lVar12 + 1) {
      *(double *)(lVar17 + lVar12 * 8) = (1.0 / dVar25) * *(double *)(lVar17 + lVar12 * 8);
    }
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    col_1 = (int)uVar21;
    std::vector<int,_std::allocator<int>_>::reserve(&nonzeroIdx,lVar18 - uVar21);
    for (; ppvVar3 = (matrix->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start, col_1 < iVar20; col_1 = col_1 + 1)
    {
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           *(ulong *)(*(long *)&(ppvVar3[uVar21]->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data + (long)col_1 * 8);
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar24 = vandpd_avx512vl(auVar26,auVar6);
      if (1e-10 < auVar24._0_8_) {
        std::vector<int,_std::allocator<int>_>::push_back(&nonzeroIdx,&col_1);
      }
    }
    uVar13 = (uint)((ulong)((long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    for (lVar17 = local_48; (int)lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
      lVar12 = *(long *)&(ppvVar3[lVar17]->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar12 + uVar21 * 8);
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar24 = vandpd_avx512vl(auVar27,auVar7);
      if (1e-10 < auVar24._0_8_) {
        auVar8._8_8_ = 0x8000000000000000;
        auVar8._0_8_ = 0x8000000000000000;
        auVar24 = vxorpd_avx512vl(auVar27,auVar8);
        uVar11 = 0;
        while ((~((int)uVar13 >> 0x1f) & uVar13) != uVar11) {
          lVar19 = (long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
          uVar11 = uVar11 + 1;
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               *(ulong *)(*(long *)&(ppvVar3[uVar21]->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data + lVar19 * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(lVar12 + lVar19 * 8);
          auVar23 = vfmadd213sd_fma(auVar30,auVar24,auVar1);
          *(long *)(lVar12 + lVar19 * 8) = auVar23._0_8_;
        }
      }
      col_1 = (int)uVar21;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>);
    local_48 = local_48 + 1;
    local_50 = local_50 + 1;
  }
  while (uVar16 = uVar16 - 1, (long)exitCondition < (long)uVar16) {
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    col_1 = (int)uVar16;
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)
               &nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>,lVar18 - uVar16);
    for (; ppvVar3 = (matrix->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start, col_1 < iVar20; col_1 = col_1 + 1)
    {
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           *(ulong *)(*(long *)&(ppvVar3[uVar16]->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data + (long)col_1 * 8);
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar24 = vandpd_avx512vl(auVar28,auVar9);
      if (1e-10 < auVar24._0_8_) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>,&col_1);
      }
    }
    uVar14 = (uint)((ulong)((long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    lVar17 = local_50;
    do {
      lVar12 = *(long *)&(ppvVar3[lVar17 + -1]->super__Vector_base<double,_std::allocator<double>_>)
                         ._M_impl.super__Vector_impl_data;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(lVar12 + uVar16 * 8);
      auVar24._8_8_ = 0x7fffffffffffffff;
      auVar24._0_8_ = 0x7fffffffffffffff;
      auVar24 = vandpd_avx512vl(auVar23,auVar24);
      if (1e-10 < auVar24._0_8_) {
        auVar10._8_8_ = 0x8000000000000000;
        auVar10._0_8_ = 0x8000000000000000;
        auVar24 = vxorpd_avx512vl(auVar23,auVar10);
        uVar21 = 0;
        while ((~((int)uVar14 >> 0x1f) & uVar14) != uVar21) {
          lVar19 = (long)nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar21];
          uVar21 = uVar21 + 1;
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               *(ulong *)(*(long *)&(ppvVar3[uVar16]->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data + lVar19 * 8);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(lVar12 + lVar19 * 8);
          auVar23 = vfmadd213sd_fma(auVar31,auVar24,auVar2);
          *(long *)(lVar12 + lVar19 * 8) = auVar23._0_8_;
        }
      }
      lVar17 = lVar17 + -1;
    } while (exitCondition < lVar17);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&nonzeroIdx.super__Vector_base<int,_std::allocator<int>_>);
    local_50 = local_50 + -1;
  }
  return;
}

Assistant:

void
opengv::math::gauss_jordan(
    std::vector<std::vector<double>*> & matrix, int exitCondition )
{  
  //create some constants for zero-checking etc.
  double precision = 1.0e-10;
  int rows = matrix.size();
  int cols = matrix[0]->size();
  
  //the working row
  int frontRow;
  
  //first step down
  for( frontRow = 0; frontRow < rows; frontRow++ )
  {
    // first iterate through the rows and find the row that has the biggest
    // leading coefficient
    double maxValue = -1.0;
    int row = -1;
    for( int tempRow = frontRow; tempRow < rows; tempRow++ )
    {
      double value = fabs((*(matrix[tempRow]))[frontRow]);
      if( value > maxValue )
      {
        row = tempRow;
        maxValue = value;
      }
    }
    
    //rowIter is now the row that should go in the place of frontRow->swap    
    std::swap( matrix[row], matrix[frontRow] );
    
    //ok, now use frontRow!
    
    //first divide all coefficients by the leading coefficient
    int col = frontRow;
    double leadingCoefficient_inv = 1.0 / (*(matrix[frontRow]))[col];
    (*(matrix[frontRow]))[col] = 1.0;
    ++col;
    while( col < cols )
    {
      (*(matrix[frontRow]))[col] *= leadingCoefficient_inv;
      ++col;
    }
    
    //create a vector of bools indicating the cols that need to be manipulated
    col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //iterate through all remaining rows, and subtract correct multiple of 
    //first row (if leading coefficient is non-zero!)
    row = frontRow;
    ++row;
    while( row < rows )
    {
      col = frontRow;
      double leadingCoefficient = (*(matrix[row]))[col];
      
      if( fabs(leadingCoefficient) > precision )
      {
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * ((*(matrix[frontRow]))[nonzeroIdx[col]]);
      }
      
      ++row;
    }
  }
  
  //set index to the last non-zero row
  --frontRow;
  
  //Now step up
  while( frontRow > exitCondition )
  {    
    //create a vector of bools indicating the cols that need to be manipulated
    int col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //get the working row
    int row = frontRow;
    
    do
    {      
      //decrement working row
      --row;
      
      //working column
      
      //now get the leading coefficient
      double leadingCoefficient = (*(matrix[row]))[frontRow];
      
      //Now iterator until the end, and subtract each time the multiplied
      //front-row
      if( fabs(leadingCoefficient) > precision )
      {        
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * (*(matrix[frontRow]))[nonzeroIdx[col]];
      }
    }
    while( row > exitCondition );
    
    --frontRow;
  }
}